

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RenderingSingleCellsPreservesRenditionPositions(RendererTests *this)

{
  bypass_alpha *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  cell *pcVar4;
  bool bVar5;
  allocator local_1d1;
  string local_1d0 [32];
  LocationInfo local_1b0;
  undefined1 auStack_188 [8];
  span reference2 [1];
  string local_170 [32];
  LocationInfo local_150;
  undefined1 auStack_128 [8];
  span reference1 [1];
  bypass_alpha local_109;
  undefined1 local_108 [8];
  cell cells2 [1];
  cell cells1 [1];
  undefined1 local_e0 [8];
  scanline_mockup sl2;
  scanline_mockup sl1;
  RendererTests *this_local;
  int len_1;
  int cover_m_1;
  int area_1;
  int x_1;
  cell *i_1;
  int cover_1;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  
  sl1._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)&sl2._inprogress,true);
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)local_e0,true);
  stack0xffffffffffffff08 = 0x140000000007;
  local_108._0_4_ = 0x13d62b;
  local_108._4_4_ = 0x1600;
  cells2[0].x = 0;
  _area = begin<agge::tests::mocks::cell,1ul>((cell (*) [1])&cells2[0].cover);
  pcVar4 = end<agge::tests::mocks::cell,1ul>((cell (*) [1])&cells2[0].cover);
  i._4_4_ = 0;
  if (_area != pcVar4) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar5 = false;
        if (_area != pcVar4) {
          bVar5 = _area->x == cover_m;
        }
      } while (bVar5);
      iVar1 = i._4_4_ * 0x200;
      if (len != 0) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(&local_109,iVar1 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)&sl2._inprogress,cover_m,uVar2)
        ;
        cover_m = cover_m + 1;
      }
      if (_area == pcVar4) break;
      iVar3 = _area->x - cover_m;
      if ((iVar3 != 0) && (iVar1 != 0)) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(&local_109,iVar1);
        anon_unknown_1::scanline_mockup::add_span
                  ((scanline_mockup *)&sl2._inprogress,cover_m,iVar3,uVar2);
      }
    }
  }
  auStack_128._0_4_ = 0x7fffffff;
  auStack_128._4_4_ = 7;
  reference1[0].y = 0;
  reference1[0].x = -0x1400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)((long)&reference2[0].cover + 3));
  ut::LocationInfo::LocationInfo(&local_150,(string *)local_170,0x65);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [1])auStack_128,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl1,&local_150);
  ut::LocationInfo::~LocationInfo(&local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[0].cover + 3));
  _area_1 = begin<agge::tests::mocks::cell,1ul>((cell (*) [1])local_108);
  pcVar4 = end<agge::tests::mocks::cell,1ul>((cell (*) [1])local_108);
  this_00 = (bypass_alpha *)((long)&reference2[0].cover + 2);
  i_1._4_4_ = 0;
  if (_area_1 != pcVar4) {
    while( true ) {
      cover_m_1 = _area_1->x;
      len_1 = 0;
      do {
        len_1 = _area_1->area + len_1;
        i_1._4_4_ = _area_1->cover + i_1._4_4_;
        _area_1 = _area_1 + 1;
        bVar5 = false;
        if (_area_1 != pcVar4) {
          bVar5 = _area_1->x == cover_m_1;
        }
      } while (bVar5);
      iVar1 = i_1._4_4_ * 0x200;
      if (len_1 != 0) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(this_00,iVar1 - len_1);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_e0,cover_m_1,uVar2);
        cover_m_1 = cover_m_1 + 1;
      }
      if (_area_1 == pcVar4) break;
      iVar3 = _area_1->x - cover_m_1;
      if ((iVar3 != 0) && (iVar1 != 0)) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(this_00,iVar1);
        anon_unknown_1::scanline_mockup::add_span((scanline_mockup *)local_e0,cover_m_1,iVar3,uVar2)
        ;
      }
    }
  }
  auStack_188._0_4_ = 0x7fffffff;
  auStack_188._4_4_ = 0x13d62b;
  reference2[0].y = 0;
  reference2[0].x = -0x1600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1d1);
  ut::LocationInfo::LocationInfo(&local_1b0,(string *)local_1d0,0x6d);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [1])auStack_188,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl2,&local_1b0);
  ut::LocationInfo::~LocationInfo(&local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)local_e0);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)&sl2._inprogress);
  return;
}

Assistant:

test( RenderingSingleCellsPreservesRenditionPositions )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 7, 10 * 512, 0 }, }, cells2[] = { { 1300011, 11 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = { { 0x7fffffff, 7, 0, -10 * 512 }, };

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());

				// ASSERT
				span reference2[] = { { 0x7fffffff, 1300011, 0, -11 * 512 }, };

				assert_equal(reference2, sl2.spans_log);
			}